

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_err_t bpptree_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                      ion_dict_cursor_t **cursor)

{
  int iVar1;
  ion_dictionary_parent_t *piVar2;
  ion_boolean_t iVar3;
  ion_bpp_err_t iVar4;
  ion_dict_cursor_t *piVar5;
  void *pvVar6;
  ion_predicate_t *piVar7;
  void *pvVar8;
  ion_bpp_err_t err_1;
  ion_bpp_err_t err;
  ion_key_t target_key;
  ion_bpp_cursor_t *bCursor;
  ion_key_size_t key_size;
  ion_bpptree_t *bpptree;
  ion_dict_cursor_t **cursor_local;
  ion_predicate_t *predicate_local;
  ion_dictionary_t *dictionary_local;
  
  piVar2 = dictionary->instance;
  iVar1 = (dictionary->instance->record).key_size;
  piVar5 = (ion_dict_cursor_t *)malloc(0x38);
  *cursor = piVar5;
  if (*cursor == (ion_dict_cursor_t *)0x0) {
    dictionary_local._7_1_ = '\x06';
  }
  else {
    piVar5 = *cursor;
    pvVar6 = malloc((long)iVar1);
    *(void **)(piVar5 + 1) = pvVar6;
    if (*(long *)(piVar5 + 1) == 0) {
      free(piVar5);
      dictionary_local._7_1_ = '\x06';
    }
    else {
      (*cursor)->dictionary = dictionary;
      (*cursor)->status = '\x03';
      (*cursor)->destroy = bpptree_destroy_cursor;
      (*cursor)->next = bpptree_next;
      piVar7 = (ion_predicate_t *)malloc(0x20);
      (*cursor)->predicate = piVar7;
      if ((*cursor)->predicate == (ion_predicate_t *)0x0) {
        free(*(void **)(piVar5 + 1));
        free(*cursor);
        dictionary_local._7_1_ = '\x06';
      }
      else {
        (*cursor)->predicate->type = predicate->type;
        (*cursor)->predicate->destroy = predicate->destroy;
        switch(predicate->type) {
        case '\0':
          pvVar6 = (predicate->statement).range.lower_bound;
          pvVar8 = malloc((long)iVar1);
          ((*cursor)->predicate->statement).range.lower_bound = pvVar8;
          if (((*cursor)->predicate->statement).range.lower_bound == (ion_key_t)0x0) {
            free((*cursor)->predicate);
            free(*(void **)(piVar5 + 1));
            free(*cursor);
            dictionary_local._7_1_ = '\x06';
          }
          else {
            memcpy(((*cursor)->predicate->statement).range.lower_bound,pvVar6,(long)iVar1);
            memcpy(*(void **)(piVar5 + 1),pvVar6,(long)iVar1);
            iVar4 = b_get(*(ion_bpp_handle_t *)(piVar2 + 1),pvVar6,
                          (ion_bpp_external_address_t *)&piVar5[1].dictionary);
            if (iVar4 == bErrOk) {
              (*cursor)->status = '\x02';
              dictionary_local._7_1_ = '\0';
            }
            else {
              (*cursor)->status = '\x01';
              dictionary_local._7_1_ = '\0';
            }
          }
          break;
        case '\x01':
          pvVar6 = malloc((long)iVar1);
          ((*cursor)->predicate->statement).range.lower_bound = pvVar6;
          if (((*cursor)->predicate->statement).range.lower_bound == (ion_key_t)0x0) {
            free((*cursor)->predicate);
            free(*(void **)(piVar5 + 1));
            free(*cursor);
            dictionary_local._7_1_ = '\x06';
          }
          else {
            memcpy(((*cursor)->predicate->statement).range.lower_bound,
                   (predicate->statement).range.lower_bound,(long)iVar1);
            pvVar6 = malloc((long)iVar1);
            ((*cursor)->predicate->statement).range.upper_bound = pvVar6;
            if (((*cursor)->predicate->statement).range.upper_bound == (ion_key_t)0x0) {
              free(((*cursor)->predicate->statement).range.lower_bound);
              free((*cursor)->predicate);
              free(*(void **)(piVar5 + 1));
              free(*cursor);
              dictionary_local._7_1_ = '\x06';
            }
            else {
              memcpy(((*cursor)->predicate->statement).range.upper_bound,
                     (predicate->statement).range.upper_bound,(long)iVar1);
              b_find_first_greater_or_equal
                        (*(ion_bpp_handle_t *)(piVar2 + 1),
                         ((*cursor)->predicate->statement).range.lower_bound,*(void **)(piVar5 + 1),
                         (ion_bpp_external_address_t *)&piVar5[1].dictionary);
              iVar3 = test_predicate(*cursor,*(ion_key_t *)(piVar5 + 1));
              if (iVar3 == '\0') {
                (*cursor)->status = '\x01';
                dictionary_local._7_1_ = '\0';
              }
              else {
                (*cursor)->status = '\x02';
                dictionary_local._7_1_ = '\0';
              }
            }
          }
          break;
        case '\x02':
          iVar4 = b_find_first_key(*(ion_bpp_handle_t *)(piVar2 + 1),*(void **)(piVar5 + 1),
                                   (ion_bpp_external_address_t *)&piVar5[1].dictionary);
          (*cursor)->status = '\x02';
          if (iVar4 != bErrOk) {
            (*cursor)->status = '\x01';
          }
          dictionary_local._7_1_ = '\0';
          break;
        case '\x03':
          dictionary_local._7_1_ = '\0';
          break;
        default:
          dictionary_local._7_1_ = '\x05';
        }
      }
    }
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
bpptree_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	ion_bpptree_t	*bpptree	= (ion_bpptree_t *) dictionary->instance;
	ion_key_size_t	key_size	= dictionary->instance->record.key_size;

	*cursor = malloc(sizeof(ion_bpp_cursor_t));

	if (NULL == *cursor) {
		return err_out_of_memory;
	}

	ion_bpp_cursor_t *bCursor = (ion_bpp_cursor_t *) (*cursor);

	bCursor->cur_key = malloc(key_size);

	if (NULL == bCursor->cur_key) {
		free(bCursor);
		return err_out_of_memory;
	}

	(*cursor)->dictionary	= dictionary;
	(*cursor)->status		= cs_cursor_uninitialized;

	(*cursor)->destroy		= bpptree_destroy_cursor;
	(*cursor)->next			= bpptree_next;

	(*cursor)->predicate	= malloc(sizeof(ion_predicate_t));

	if (NULL == (*cursor)->predicate) {
		free(bCursor->cur_key);
		free(*cursor);
		return err_out_of_memory;
	}

	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	switch (predicate->type) {
		case predicate_equality: {
			ion_key_t target_key = predicate->statement.equality.equality_value;

			(*cursor)->predicate->statement.equality.equality_value = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.equality.equality_value) {
				free((*cursor)->predicate);
				free(bCursor->cur_key);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.equality.equality_value, target_key, key_size);

			memcpy(bCursor->cur_key, target_key, key_size);

			ion_bpp_err_t err = b_get(bpptree->tree, target_key, &bCursor->offset);

			if (bErrOk != err) {
				/* If this happens, that means the target key doesn't exist */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;
				return err_ok;
			}

			break;
		}

		case predicate_range: {
			(*cursor)->predicate->statement.range.lower_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.lower_bound) {
				free((*cursor)->predicate);
				free(bCursor->cur_key);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, key_size);

			(*cursor)->predicate->statement.range.upper_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.upper_bound) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(bCursor->cur_key);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, key_size);

			/* We search for the FGEQ of the Lower bound. */
			b_find_first_greater_or_equal(bpptree->tree, (*cursor)->predicate->statement.range.lower_bound, bCursor->cur_key, &bCursor->offset);

			/* If the key returned doesn't satisfy the predicate, we can exit */
			if (boolean_false == test_predicate(*cursor, bCursor->cur_key)) {
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;
				return err_ok;
			}

			break;
		}

		case predicate_all_records: {
			ion_bpp_err_t err;

			/* We search for first key in B++ tree. */
			err					= b_find_first_key(bpptree->tree, bCursor->cur_key, &bCursor->offset);

			(*cursor)->status	= cs_cursor_initialized;

			if (bErrOk != err) {
				(*cursor)->status = cs_end_of_results;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	return err_ok;
}